

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

void __thiscall
cs::compiler_type::opt_expr
          (compiler_type *this,tree_type<cs::token_base_*> *tree,iterator it,optm_type do_optm)

{
  slot_type **ppsVar1;
  token_base *ptVar2;
  _func_int **pp_Var3;
  tree_type<cs::token_base_*> *ptVar4;
  token_base *ptVar5;
  slot_type *psVar6;
  bool bVar7;
  int iVar8;
  token_base **pptVar9;
  callable *pcVar10;
  type_info *ptVar11;
  shared_ptr<cs::name_space> *psVar12;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *pdVar13;
  bool *pbVar14;
  iterator iVar15;
  token_value *ptVar16;
  undefined4 extraout_var;
  object_method *poVar17;
  size_type sVar18;
  compile_error *pcVar19;
  tree_type<cs::token_base_*> *tree_1;
  domain_type *pdVar20;
  size_t sVar21;
  _func_int **pp_Var22;
  vector *this_00;
  tree_type<cs::token_base_*> *ptVar23;
  _Elt_pointer paVar24;
  any *it_1;
  slot_type *psVar25;
  any *it_2;
  tree_type<cs::token_base_*> *tree_00;
  CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  CVar26;
  _func_int **pp_Var27;
  initializer_list<cs_impl::any> __l;
  tree_type<cs::token_base_*> ltree;
  iterator it_local;
  any local_d0;
  slot_type *local_c8;
  CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  local_c0;
  domain_type *local_b8;
  domain_type *local_b0;
  vector args;
  domain_type *local_88;
  CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  local_80;
  slot_type *local_78;
  aligned_type *local_58;
  anon_struct_8_0_00000001_for___align local_48;
  domain_type *local_40;
  
  if (it.mData == (tree_node *)0x0) {
    return;
  }
  it_local = it;
  pptVar9 = tree_type<cs::token_base_*>::iterator::data(&it_local);
  ptVar2 = *pptVar9;
  if (ptVar2 == (token_base *)0x0) {
    return;
  }
  iVar8 = (*ptVar2->_vptr_token_base[2])(ptVar2);
  switch(iVar8) {
  case 3:
    iVar8 = *(int *)&ptVar2[1]._vptr_token_base;
    switch(iVar8) {
    case 0x27:
      iVar15 = tree_type<cs::token_base_*>::iterator::left(&it_local);
      opt_expr(this,tree,iVar15,do_optm);
      iVar15 = tree_type<cs::token_base_*>::iterator::right(&it_local);
      opt_expr(this,tree,iVar15,do_optm);
      args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)tree_type<cs::token_base_*>::iterator::left(&it_local);
      pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&args);
      ptVar2 = *pptVar9;
      args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)tree_type<cs::token_base_*>::iterator::right(&it_local);
      pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&args);
      if (((ptVar2 == (token_base *)0x0) || (ptVar5 = *pptVar9, ptVar5 == (token_base *)0x0)) ||
         (iVar8 = (*ptVar5->_vptr_token_base[2])(ptVar5), iVar8 != 0xd)) {
        pcVar19 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&args,"Wrong syntax for function call.",(allocator *)&ltree);
        compile_error::compile_error(pcVar19,(string *)&args);
        __cxa_throw(pcVar19,&compile_error::typeinfo,compile_error::~compile_error);
      }
      iVar8 = (*ptVar2->_vptr_token_base[2])(ptVar2);
      if (iVar8 != 7) {
        return;
      }
      pdVar20 = (domain_type *)(ptVar2 + 1);
      ptVar11 = cs_impl::any::type((any *)pdVar20);
      bVar7 = std::type_info::operator==(ptVar11,(type_info *)&callable::typeinfo);
      local_b0 = pdVar20;
      if ((bVar7) &&
         (pcVar10 = cs_impl::any::const_val<cs::callable>((any *)pdVar20),
         pcVar10->mType == request_fold)) {
        local_c8 = (slot_type *)(ptVar5 + 1);
        pp_Var22 = ptVar5[2]._vptr_token_base;
        pp_Var27 = ptVar5[3]._vptr_token_base;
        local_c0.
        super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
        .
        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
        .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                  )ptVar5[3].line_num;
        pp_Var3 = ptVar5[4]._vptr_token_base;
        while (pp_Var22 != pp_Var3) {
          args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*pp_Var22;
          pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&args);
          ptVar2 = *pptVar9;
          if ((ptVar2 == (token_base *)0x0) ||
             (iVar8 = (*ptVar2->_vptr_token_base[2])(ptVar2), iVar8 != 6)) {
            args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*pp_Var22;
          }
          else {
            args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ptVar2[1]._vptr_token_base;
          }
          bVar7 = optimizable(this,(iterator *)&args);
          if (!bVar7) {
            return;
          }
          pp_Var22 = pp_Var22 + 1;
          if (pp_Var22 == pp_Var27) {
            pp_Var22 = *(_func_int ***)
                        ((long)local_c0.
                               super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                               .
                               super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                               .value + 8);
            local_c0.
            super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
            .
            super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
            .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                      )((long)local_c0.
                              super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                              .
                              super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                              .value + 8);
            pp_Var27 = pp_Var22 + 0x40;
          }
        }
        tree_type<cs::token_base_*>::iterator::data(&it_local);
        args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        sVar18 = std::
                 deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                 ::size((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                         *)&local_c8->value);
        std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::reserve(&args,sVar18);
        CVar26.
        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
        .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                  )ptVar5[2]._vptr_token_base;
        local_c8 = (slot_type *)ptVar5[3]._vptr_token_base;
        local_58 = (aligned_type *)ptVar5[3].line_num;
        local_c0.
        super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
        .
        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
        .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                  )ptVar5[4]._vptr_token_base;
        while ((CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                )CVar26.
                 super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                 .value !=
               local_c0.
               super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
               .
               super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
               .value) {
          ltree.mRoot = *(tree_node **)
                         CVar26.
                         super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                         .value;
          pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&ltree);
          ptVar2 = *pptVar9;
          if ((ptVar2 == (token_base *)0x0) ||
             (iVar8 = (*ptVar2->_vptr_token_base[2])(ptVar2), iVar8 != 6)) {
            local_48 = *(anon_struct_8_0_00000001_for___align *)
                        CVar26.
                        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                        .value;
            runtime_type::parse_expr
                      ((runtime_type *)&local_d0,
                       (iterator *)
                       (((this->context).
                         super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,SUB81(&local_48,0));
            lvalue((var *)&local_d0);
            std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                      (&args,(any *)&ltree);
            cs_impl::any::recycle((any *)&ltree);
            cs_impl::any::recycle(&local_d0);
          }
          else {
            local_d0.mDat = (proxy *)ptVar2[1]._vptr_token_base;
            runtime_type::parse_expr
                      ((runtime_type *)&ltree,
                       (iterator *)
                       (((this->context).
                         super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,SUB81(&local_d0,0));
            pdVar13 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                                ((any *)&ltree);
            cs_impl::any::recycle((any *)&ltree);
            psVar25 = (slot_type *)
                      (pdVar13->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_cur;
            paVar24 = (pdVar13->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_last;
            local_b8 = (domain_type *)
                       (pdVar13->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                       _M_impl.super__Deque_impl_data._M_start._M_node;
            psVar6 = (slot_type *)
                     (pdVar13->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                     _M_impl.super__Deque_impl_data._M_finish._M_cur;
            while (psVar25 != psVar6) {
              lvalue((var *)&psVar25->value);
              std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                        (&args,(any *)&ltree);
              cs_impl::any::recycle((any *)&ltree);
              psVar25 = (slot_type *)&(psVar25->value).first._M_string_length;
              if (psVar25 == (slot_type *)paVar24) {
                psVar25 = (local_b8->m_reflect).
                          super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                          .
                          super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                          .slots_;
                local_b8 = (domain_type *)
                           &(local_b8->m_reflect).
                            super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            .
                            super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            .slots_;
                paVar24 = (_Elt_pointer)((long)psVar25 + 0x200);
              }
            }
          }
          CVar26.
          super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
          .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                    )((long)CVar26.
                            super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                            .value + 8);
          if (CVar26.
              super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
              .value == (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                         )local_c8) {
            CVar26.
            super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
            .value = *(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                       *)(local_58->__data + 8);
            local_58 = (aligned_type *)(local_58->__data + 8);
            local_c8 = (slot_type *)
                       ((long)CVar26.
                              super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                              .value + 0x200);
          }
        }
        pcVar10 = cs_impl::any::const_val<cs::callable>((any *)local_b0);
        std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
        operator()((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                    *)&ltree,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar10);
        ptVar16 = new_value(this,(var *)&ltree);
        pptVar9 = tree_type<cs::token_base_*>::iterator::data(&it_local);
      }
      else {
        ptVar11 = cs_impl::any::type((any *)pdVar20);
        bVar7 = std::type_info::operator==(ptVar11,(type_info *)&object_method::typeinfo);
        if (!bVar7) {
          return;
        }
        poVar17 = cs_impl::any::const_val<cs::object_method>((any *)local_b0);
        if (poVar17->is_request_fold != true) {
          return;
        }
        local_c8 = (slot_type *)(ptVar5 + 1);
        pp_Var22 = ptVar5[2]._vptr_token_base;
        pp_Var27 = ptVar5[3]._vptr_token_base;
        local_c0.
        super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
        .
        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
        .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                  )ptVar5[3].line_num;
        pp_Var3 = ptVar5[4]._vptr_token_base;
        while (pp_Var22 != pp_Var3) {
          args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*pp_Var22;
          pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&args);
          ptVar2 = *pptVar9;
          if ((ptVar2 == (token_base *)0x0) ||
             (iVar8 = (*ptVar2->_vptr_token_base[2])(ptVar2), iVar8 != 6)) {
            args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*pp_Var22;
          }
          else {
            args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ptVar2[1]._vptr_token_base;
          }
          bVar7 = optimizable(this,(iterator *)&args);
          if (!bVar7) {
            return;
          }
          pp_Var22 = pp_Var22 + 1;
          if (pp_Var22 == pp_Var27) {
            pp_Var22 = *(_func_int ***)
                        ((long)local_c0.
                               super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                               .
                               super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                               .value + 8);
            local_c0.
            super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
            .
            super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
            .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                      )((long)local_c0.
                              super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                              .
                              super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                              .value + 8);
            pp_Var27 = pp_Var22 + 0x40;
          }
        }
        tree_type<cs::token_base_*>::iterator::data(&it_local);
        poVar17 = cs_impl::any::const_val<cs::object_method>((any *)local_b0);
        ltree.mRoot = (tree_node *)(poVar17->object).mDat;
        if (ltree.mRoot != (tree_node *)0x0) {
          (ltree.mRoot)->left = (tree_node *)((long)&(ltree.mRoot)->left->root + 1);
        }
        __l._M_len = 1;
        __l._M_array = (iterator)&ltree;
        std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
                  (&args,__l,(allocator_type *)&local_d0);
        cs_impl::any::recycle((any *)&ltree);
        sVar18 = std::
                 deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                 ::size((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                         *)&local_c8->value);
        std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::reserve(&args,sVar18);
        CVar26.
        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
        .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                  )ptVar5[2]._vptr_token_base;
        local_c8 = (slot_type *)ptVar5[3]._vptr_token_base;
        local_b0 = (domain_type *)ptVar5[3].line_num;
        local_c0.
        super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
        .
        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
        .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                  )ptVar5[4]._vptr_token_base;
        while ((CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                )CVar26.
                 super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                 .value !=
               local_c0.
               super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
               .
               super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
               .value) {
          ltree.mRoot = *(tree_node **)
                         CVar26.
                         super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                         .value;
          pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&ltree);
          ptVar2 = *pptVar9;
          if ((ptVar2 == (token_base *)0x0) ||
             (iVar8 = (*ptVar2->_vptr_token_base[2])(ptVar2), iVar8 != 6)) {
            local_48 = *(anon_struct_8_0_00000001_for___align *)
                        CVar26.
                        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                        .value;
            runtime_type::parse_expr
                      ((runtime_type *)&local_d0,
                       (iterator *)
                       (((this->context).
                         super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,SUB81(&local_48,0));
            lvalue((var *)&local_d0);
            std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                      (&args,(any *)&ltree);
            cs_impl::any::recycle((any *)&ltree);
            cs_impl::any::recycle(&local_d0);
          }
          else {
            local_d0.mDat = (proxy *)ptVar2[1]._vptr_token_base;
            runtime_type::parse_expr
                      ((runtime_type *)&ltree,
                       (iterator *)
                       (((this->context).
                         super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,SUB81(&local_d0,0));
            pdVar13 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                                ((any *)&ltree);
            cs_impl::any::recycle((any *)&ltree);
            psVar25 = (slot_type *)
                      (pdVar13->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_cur;
            paVar24 = (pdVar13->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_last;
            local_b8 = (domain_type *)
                       (pdVar13->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                       _M_impl.super__Deque_impl_data._M_start._M_node;
            psVar6 = (slot_type *)
                     (pdVar13->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                     _M_impl.super__Deque_impl_data._M_finish._M_cur;
            while (psVar25 != psVar6) {
              lvalue((var *)&psVar25->value);
              std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                        (&args,(any *)&ltree);
              cs_impl::any::recycle((any *)&ltree);
              psVar25 = (slot_type *)&(psVar25->value).first._M_string_length;
              if (psVar25 == (slot_type *)paVar24) {
                psVar25 = (local_b8->m_reflect).
                          super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                          .
                          super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                          .slots_;
                local_b8 = (domain_type *)
                           &(local_b8->m_reflect).
                            super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            .
                            super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            .slots_;
                paVar24 = (_Elt_pointer)((long)psVar25 + 0x200);
              }
            }
          }
          CVar26.
          super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
          .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                    )((long)CVar26.
                            super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                            .value + 8);
          if (CVar26.
              super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
              .value == (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                         )local_c8) {
            CVar26.
            super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
            .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                      )(local_b0->m_reflect).
                       super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       .
                       super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       .slots_;
            local_b0 = (domain_type *)
                       &(local_b0->m_reflect).
                        super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        .
                        super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        .slots_;
            local_c8 = (slot_type *)
                       ((long)CVar26.
                              super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                              .value + 0x200);
          }
        }
        pcVar10 = cs_impl::any::const_val<cs::callable>(&poVar17->callable);
        std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
        operator()((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                    *)&ltree,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar10);
        ptVar16 = new_value(this,(var *)&ltree);
        pptVar9 = tree_type<cs::token_base_*>::iterator::data(&it_local);
      }
      *pptVar9 = &ptVar16->super_token_base;
      cs_impl::any::recycle((any *)&ltree);
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&args);
      return;
    case 0x28:
    case 0x29:
    case 0x2a:
      break;
    case 0x2b:
      args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)tree_type<cs::token_base_*>::iterator::left(&it_local);
      pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&args);
      if (*pptVar9 == (token_base *)0x0) {
        return;
      }
      pcVar19 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&args,"Wrong grammar for new expression.",(allocator *)&ltree);
      compile_error::compile_error(pcVar19,(string *)&args);
      __cxa_throw(pcVar19,&compile_error::typeinfo,compile_error::~compile_error);
    case 0x2c:
      args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)tree_type<cs::token_base_*>::iterator::left(&it_local);
      pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&args);
      if (*pptVar9 != (token_base *)0x0) {
        pcVar19 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&args,"Wrong grammar for gcnew expression.",(allocator *)&ltree);
        compile_error::compile_error(pcVar19,(string *)&args);
        __cxa_throw(pcVar19,&compile_error::typeinfo,compile_error::~compile_error);
      }
      iVar15 = tree_type<cs::token_base_*>::iterator::right(&it_local);
      goto LAB_0012d80d;
    case 0x2d:
      args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)tree_type<cs::token_base_*>::iterator::left(&it_local);
      pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&args);
      if (*pptVar9 != (token_base *)0x0) {
        ltree.mRoot = (tree_node *)tree_type<cs::token_base_*>::iterator::right(&it_local);
        pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&ltree);
        if (*pptVar9 != (token_base *)0x0) {
          local_d0.mDat = (proxy *)tree_type<cs::token_base_*>::iterator::right(&it_local);
          pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_d0);
          iVar8 = (*(*pptVar9)->_vptr_token_base[2])();
          if (iVar8 == 4) {
            iVar15 = tree_type<cs::token_base_*>::iterator::left(&it_local);
            goto LAB_0012d80d;
          }
        }
      }
      pcVar19 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&args,"Wrong grammar for arrow expression.",(allocator *)&ltree);
      compile_error::compile_error(pcVar19,(string *)&args);
      __cxa_throw(pcVar19,&compile_error::typeinfo,compile_error::~compile_error);
    default:
      if (iVar8 == 0xe) {
        iVar15 = tree_type<cs::token_base_*>::iterator::left(&it_local);
        iVar8 = tree_type<cs::token_base_*>::copy((EVP_PKEY_CTX *)iVar15.mData,(EVP_PKEY_CTX *)0x0);
        ltree.mRoot = (tree_node *)CONCAT44(extraout_var,iVar8);
        iVar15 = tree_type<cs::token_base_*>::iterator::left(&it_local);
        opt_expr(this,tree,iVar15,enable_namespace_optm);
        args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)tree_type<cs::token_base_*>::iterator::left(&it_local);
        pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&args);
        ptVar2 = *pptVar9;
        args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)tree_type<cs::token_base_*>::iterator::right(&it_local);
        pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&args);
        ptVar5 = *pptVar9;
        if ((ptVar5 != (token_base *)0x0) &&
           (iVar8 = (*ptVar5->_vptr_token_base[2])(ptVar5), iVar8 == 4)) {
          if ((ptVar2 != (token_base *)0x0) &&
             (iVar8 = (*ptVar2->_vptr_token_base[2])(ptVar2), iVar8 == 7)) {
            tree_type<cs::token_base_*>::iterator::data(&it_local);
            runtime_type::parse_dot
                      ((runtime_type *)&args,
                       (var *)(((this->context).
                                super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->instance).
                              super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,ptVar2 + 1);
            if ((args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) &&
               (0 < *(short *)((long)&(args.
                                       super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->mDat + 2))) {
              ptVar16 = new_value(this,(var *)&args);
              pptVar9 = tree_type<cs::token_base_*>::iterator::data(&it_local);
              *pptVar9 = &ptVar16->super_token_base;
            }
            cs_impl::any::recycle((any *)&args);
          }
          tree_type<cs::token_base_*>::~tree_type(&ltree);
          return;
        }
        pcVar19 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&args,"Wrong grammar for dot expression.",(allocator *)&local_d0);
        compile_error::compile_error(pcVar19,(string *)&args);
        __cxa_throw(pcVar19,&compile_error::typeinfo,compile_error::~compile_error);
      }
      if (iVar8 == 0x11) {
        args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)tree_type<cs::token_base_*>::iterator::left(&it_local);
        pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&args);
        if (*pptVar9 != (token_base *)0x0) {
          ltree.mRoot = (tree_node *)tree_type<cs::token_base_*>::iterator::right(&it_local);
          pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&ltree);
          if (*pptVar9 != (token_base *)0x0) {
            iVar15 = tree_type<cs::token_base_*>::iterator::left(&it_local);
            opt_expr(this,tree,iVar15,do_optm);
            iVar15 = tree_type<cs::token_base_*>::iterator::right(&it_local);
            goto LAB_0012d80d;
          }
        }
        pcVar19 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&args,"Wrong grammar for assign expression.",(allocator *)&ltree);
        compile_error::compile_error(pcVar19,(string *)&args);
        __cxa_throw(pcVar19,&compile_error::typeinfo,compile_error::~compile_error);
      }
      if (iVar8 == 0x1d) {
        args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)tree_type<cs::token_base_*>::iterator::right(&it_local);
        pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&args);
        ptVar2 = *pptVar9;
        if (((ptVar2 == (token_base *)0x0) ||
            (ptVar2->_vptr_token_base != (_func_int **)&PTR__token_base_00248ed0)) ||
           (*(int *)&ptVar2[1]._vptr_token_base != 0x1c)) {
          pcVar19 = (compile_error *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&args,"Wrong grammar for choice expression.",(allocator *)&ltree);
          compile_error::compile_error(pcVar19,(string *)&args);
          __cxa_throw(pcVar19,&compile_error::typeinfo,compile_error::~compile_error);
        }
        iVar15 = tree_type<cs::token_base_*>::iterator::left(&it_local);
        opt_expr(this,tree,iVar15,do_optm);
        args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)tree_type<cs::token_base_*>::iterator::right(&it_local);
        iVar15 = tree_type<cs::token_base_*>::iterator::left((iterator *)&args);
        opt_expr(this,tree,iVar15,do_optm);
        args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)tree_type<cs::token_base_*>::iterator::right(&it_local);
        iVar15 = tree_type<cs::token_base_*>::iterator::right((iterator *)&args);
        opt_expr(this,tree,iVar15,do_optm);
        args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)tree_type<cs::token_base_*>::iterator::left(&it_local);
        pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&args);
        ptVar2 = *pptVar9;
        if (ptVar2 == (token_base *)0x0) {
          return;
        }
        if (ptVar2->_vptr_token_base != (_func_int **)&PTR__token_value_00248f08) {
          return;
        }
        ptVar11 = cs_impl::any::type((any *)(ptVar2 + 1));
        bVar7 = std::type_info::operator==(ptVar11,(type_info *)&bool::typeinfo);
        if (bVar7) {
          pbVar14 = cs_impl::any::const_val<bool>((any *)(ptVar2 + 1));
          bVar7 = *pbVar14;
          iVar15 = tree_type<cs::token_base_*>::iterator::right(&it_local);
          if (bVar7 == true) {
            tree_type<cs::token_base_*>::reserve_left(tree,iVar15);
          }
          else {
            tree_type<cs::token_base_*>::reserve_right(tree,iVar15);
          }
          tree_type<cs::token_base_*>::reserve_right(tree,it_local);
          return;
        }
        pcVar19 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&args,"Choice condition must be boolean.",(allocator *)&ltree);
        compile_error::compile_error(pcVar19,(string *)&args);
        __cxa_throw(pcVar19,&compile_error::typeinfo,compile_error::~compile_error);
      }
    }
  default:
    iVar15 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    opt_expr(this,tree,iVar15,do_optm);
    iVar15 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    opt_expr(this,tree,iVar15,do_optm);
    args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)tree_type<cs::token_base_*>::iterator::left(&it_local);
    bVar7 = optimizable(this,(iterator *)&args);
    if (!bVar7) {
      return;
    }
    ltree.mRoot = (tree_node *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    bVar7 = optimizable(this,(iterator *)&ltree);
    if (!bVar7) {
      return;
    }
    tree_type<cs::token_base_*>::iterator::data(&it_local);
    runtime_type::parse_expr
              ((runtime_type *)&args,
               (iterator *)
               (((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,SUB81(&it_local,0));
    ptVar16 = new_value(this,(var *)&args);
    cs_impl::any::recycle((any *)&args);
    tree_type<cs::token_base_*>::erase_left(tree,it_local);
    tree_type<cs::token_base_*>::erase_right(tree,it_local);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data(&it_local);
    *pptVar9 = &ptVar16->super_token_base;
    return;
  case 4:
    domain_manager::get_var_optimizable<cs::var_id_const&>
              ((domain_manager *)&ltree,
               (var_id *)
               &(((((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->instance).
                  super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_runtime_type).storage);
    this_00 = (vector *)&ltree;
    if ((ltree.mRoot != (tree_node *)0x0) &&
       (this_00 = (vector *)&ltree, 0 < *(short *)((long)&(ltree.mRoot)->root + 2))) {
      if (do_optm != enable_namespace_optm) {
        ptVar11 = (type_info *)(*(code *)(ltree.mRoot)->right->root->right)();
        bVar7 = std::type_info::operator!=
                          (ptVar11,(type_info *)&std::shared_ptr<cs::name_space>::typeinfo);
        if (!bVar7) {
          psVar12 = cs_impl::any::const_val<std::shared_ptr<cs::name_space>>((any *)&ltree);
          pdVar20 = ((psVar12->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->m_data;
          std::__cxx11::string::string
                    ((string *)&args,"__PRAGMA_CS_NAMESPACE_DEFINITION__",(allocator *)&local_d0);
          bVar7 = domain_type::exist(pdVar20,(string *)&args);
          std::__cxx11::string::~string((string *)&args);
          this_00 = (vector *)&ltree;
          if (bVar7) break;
        }
      }
      ptVar16 = new_value(this,(var *)&ltree);
      pptVar9 = tree_type<cs::token_base_*>::iterator::data(&it_local);
      *pptVar9 = &ptVar16->super_token_base;
      this_00 = (vector *)&ltree;
    }
    break;
  case 6:
    iVar15.mData = (tree_node *)ptVar2[1]._vptr_token_base;
    tree = (tree_type<cs::token_base_*> *)(ptVar2 + 1);
LAB_0012d80d:
    opt_expr(this,tree,iVar15,do_optm);
    return;
  case 8:
    tree_type<cs::token_base_*>::iterator::data(&it_local);
    runtime_type::get_string_literal
              ((runtime_type *)&args,
               (string *)
               (((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(string *)(ptVar2 + 1));
    ptVar16 = new_value(this,(var *)&args);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data(&it_local);
    *pptVar9 = &ptVar16->super_token_base;
    this_00 = &args;
    break;
  case 0xe:
    CVar26.
    super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
    .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
              )ptVar2[2]._vptr_token_base;
    local_c8 = (slot_type *)ptVar2[3]._vptr_token_base;
    local_b8 = (domain_type *)ptVar2[3].line_num;
    local_c0.
    super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
    .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              )ptVar2[4]._vptr_token_base;
    while( true ) {
      if ((CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
           )CVar26.
            super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
            .value ==
          local_c0.
          super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
          .
          super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
          .value) {
        tree_type<cs::token_base_*>::iterator::data(&it_local);
        std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_Deque_base
                  ((_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_> *)&args);
        CVar26.
        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
        .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                  )ptVar2[2]._vptr_token_base;
        local_c8 = (slot_type *)ptVar2[3]._vptr_token_base;
        local_b0 = (domain_type *)ptVar2[3].line_num;
        local_c0.
        super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
        .
        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
        .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                  )ptVar2[4]._vptr_token_base;
        while (psVar25 = (slot_type *)
                         args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
              (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
               )CVar26.
                super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                .value !=
              local_c0.
              super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              .
              super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
              .value) {
          ltree.mRoot = *(tree_node **)
                         CVar26.
                         super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                         .value;
          pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&ltree);
          ptVar2 = *pptVar9;
          if ((ptVar2 == (token_base *)0x0) ||
             (iVar8 = (*ptVar2->_vptr_token_base[2])(ptVar2), iVar8 != 6)) {
            local_d0.mDat =
                 *(proxy **)
                  CVar26.
                  super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                  .value;
            runtime_type::parse_expr
                      ((runtime_type *)&stack0xffffffffffffffc8,
                       (iterator *)
                       (((this->context).
                         super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,SUB81(&local_d0,0));
            copy((EVP_PKEY_CTX *)&ltree,(EVP_PKEY_CTX *)&stack0xffffffffffffffc8);
            std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                      ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&args,(any *)&ltree);
            cs_impl::any::recycle((any *)&ltree);
            cs_impl::any::recycle((any *)&stack0xffffffffffffffc8);
          }
          else {
            local_d0.mDat = (proxy *)ptVar2[1]._vptr_token_base;
            runtime_type::parse_expr
                      ((runtime_type *)&ltree,
                       (iterator *)
                       (((this->context).
                         super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,SUB81(&local_d0,0));
            pdVar13 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                                ((any *)&ltree);
            cs_impl::any::recycle((any *)&ltree);
            psVar25 = (slot_type *)
                      (pdVar13->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_cur;
            paVar24 = (pdVar13->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_last;
            local_b8 = (domain_type *)
                       (pdVar13->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                       _M_impl.super__Deque_impl_data._M_start._M_node;
            psVar6 = (slot_type *)
                     (pdVar13->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                     _M_impl.super__Deque_impl_data._M_finish._M_cur;
            while (psVar25 != psVar6) {
              local_40 = (domain_type *)(psVar25->value).first._M_dataplus._M_p;
              if (local_40 != (domain_type *)0x0) {
                ppsVar1 = &(local_40->m_reflect).
                           super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           .
                           super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           .slots_;
                *ppsVar1 = (slot_type *)((long)&((*ppsVar1)->value).first._M_dataplus._M_p + 1);
              }
              copy((EVP_PKEY_CTX *)&ltree,(EVP_PKEY_CTX *)&local_40);
              std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                        ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&args,(any *)&ltree);
              cs_impl::any::recycle((any *)&ltree);
              cs_impl::any::recycle((any *)&local_40);
              psVar25 = (slot_type *)&(psVar25->value).first._M_string_length;
              if (psVar25 == (slot_type *)paVar24) {
                psVar25 = (local_b8->m_reflect).
                          super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                          .
                          super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                          .slots_;
                local_b8 = (domain_type *)
                           &(local_b8->m_reflect).
                            super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            .
                            super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            .slots_;
                paVar24 = (_Elt_pointer)((long)psVar25 + 0x200);
              }
            }
          }
          CVar26.
          super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
          .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                    )((long)CVar26.
                            super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                            .value + 8);
          if (CVar26.
              super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
              .value == (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                         )local_c8) {
            CVar26.
            super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
            .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                      )(local_b0->m_reflect).
                       super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       .
                       super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       .slots_;
            local_b0 = (domain_type *)
                       &(local_b0->m_reflect).
                        super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        .
                        super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        .slots_;
            local_c8 = (slot_type *)
                       ((long)CVar26.
                              super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                              .value + 0x200);
          }
        }
        while (psVar25 != local_78) {
          add_constant(this,(var *)&psVar25->value);
          psVar25 = (slot_type *)&(psVar25->value).first._M_string_length;
          if (psVar25 == (slot_type *)local_88) {
            ppsVar1 = (slot_type **)
                      ((long)local_80.
                             super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                             .
                             super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                             .value + 8);
            local_80.
            super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
            .
            super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
            .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                      )((long)local_80.
                              super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                              .
                              super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                              .value + 8);
            local_88 = (domain_type *)&(&(*ppsVar1)->value)[0xc].second;
            psVar25 = *ppsVar1;
          }
        }
        cs_impl::any::
        make<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                  ((any *)&ltree,(deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&args);
        ptVar16 = new_value(this,(var *)&ltree);
        pptVar9 = tree_type<cs::token_base_*>::iterator::data(&it_local);
        *pptVar9 = &ptVar16->super_token_base;
        cs_impl::any::recycle((any *)&ltree);
        std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque
                  ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)&args);
        return;
      }
      args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_start =
           *(pointer *)
            CVar26.
            super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
            .value;
      pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&args);
      ptVar5 = *pptVar9;
      if ((ptVar5 == (token_base *)0x0) ||
         (iVar8 = (*ptVar5->_vptr_token_base[2])(ptVar5), iVar8 != 6)) {
        optimize_expression(this,(tree_type<cs::token_base_*> *)
                                 CVar26.
                                 super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                                 .value,do_optm);
        args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
        super__Vector_impl_data._M_start =
             *(pointer *)
              CVar26.
              super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
              .value;
      }
      else {
        optimize_expression(this,(tree_type<cs::token_base_*> *)(ptVar5 + 1),do_optm);
        args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ptVar5[1]._vptr_token_base;
      }
      bVar7 = optimizable(this,(iterator *)&args);
      if (!bVar7) break;
      CVar26.
      super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
      .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                )((long)CVar26.
                        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                        .value + 8);
      if (CVar26.
          super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
          .value == (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                     )local_c8) {
        CVar26.
        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
        .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                  )(local_b8->m_reflect).
                   super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   .
                   super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   .slots_;
        local_b8 = (domain_type *)
                   &(local_b8->m_reflect).
                    super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    .
                    super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    .slots_;
        local_c8 = (slot_type *)
                   ((long)CVar26.
                          super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                          .value + 0x200);
      }
    }
    return;
  case 0xf:
    tree_00 = (tree_type<cs::token_base_*> *)ptVar2[2]._vptr_token_base;
    ptVar23 = (tree_type<cs::token_base_*> *)ptVar2[3]._vptr_token_base;
    sVar21 = ptVar2[3].line_num;
    ptVar4 = (tree_type<cs::token_base_*> *)ptVar2[4]._vptr_token_base;
    while (tree_00 != ptVar4) {
      optimize_expression(this,tree_00,do_optm);
      tree_00 = tree_00 + 1;
      if (tree_00 == ptVar23) {
        tree_00 = *(tree_type<cs::token_base_*> **)(sVar21 + 8);
        sVar21 = sVar21 + 8;
        ptVar23 = tree_00 + 0x40;
      }
    }
    return;
  }
  cs_impl::any::recycle((any *)this_00);
  return;
}

Assistant:

void
	compiler_type::opt_expr(tree_type<token_base *> &tree, tree_type<token_base *>::iterator it, optm_type do_optm)
	{
		if (!it.usable())
			return;
		token_base *token = it.data();
		if (token == nullptr)
			return;
		switch (token->get_type()) {
		default:
			break;
		case token_types::id: {
			var value = context->instance->storage.get_var_optimizable(static_cast<token_id *>(token)->get_id());
			if (value.usable() && value.is_protect()) {
				if (do_optm == optm_type::enable_namespace_optm || value.type() != typeid(namespace_t) ||
				        !value.const_val<namespace_t>()->get_domain().exist("__PRAGMA_CS_NAMESPACE_DEFINITION__"))
					it.data() = new_value(value);
			}
			return;
		}
		case token_types::literal: {
			token_literal *ptr = static_cast<token_literal *>(token);
			token_base *oldt = it.data();
			try {
				it.data() = new_value(context->instance->get_string_literal(ptr->get_data(), ptr->get_literal()));
			}
			catch (...) {
				it.data() = oldt;
			}
			return;
		}
		case token_types::expand: {
			tree_type<token_base *> &tree = static_cast<token_expand *>(token)->get_tree();
			opt_expr(tree, tree.root(), do_optm);
			return;
		}
		case token_types::array: {
			token_base *ptr = nullptr;
			for (auto &tree: static_cast<token_array *>(token)->get_array()) {
				ptr = tree.root().data();
				if (ptr != nullptr && ptr->get_type() == token_types::expand) {
					auto &child_tree = static_cast<token_expand *>(ptr)->get_tree();
					optimize_expression(child_tree, do_optm);
					if (!optimizable(child_tree.root()))
						return;
				}
				else {
					optimize_expression(tree, do_optm);
					if (!optimizable(tree.root()))
						return;
				}
			}
			token_base *oldt = it.data();
			try {
				array arr;
				for (auto &tree: static_cast<token_array *>(token)->get_array()) {
					ptr = tree.root().data();
					if (ptr != nullptr && ptr->get_type() == token_types::expand) {
						const auto &child_arr = context->instance->parse_expr(
						                            static_cast<token_expand *>(ptr)->get_tree().root()).const_val<array>();
						for (auto &it: child_arr)
							arr.push_back(copy(it));
					}
					else
						arr.push_back(copy(context->instance->parse_expr(tree.root())));
				}
				for (auto &it: arr)
					add_constant(it);
				it.data() = new_value(var::make<array>(std::move(arr)));
			}
			catch (...) {
				it.data() = oldt;
			}
			return;
		}
		case token_types::parallel: {
			for (auto &tree: static_cast<token_parallel *>(token)->get_parallel())
				optimize_expression(tree, do_optm);
			return;
		}
		case token_types::signal: {
			switch (static_cast<token_signal *>(token)->get_signal()) {
			default:
				break;
			case signal_types::new_:
				// Fix(2020-11-26): Terminate new expression optimization
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for new expression.");
				return;
			case signal_types::gcnew_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for gcnew expression.");
				opt_expr(tree, it.right(), do_optm);
				return;
			case signal_types::asi_:
				if (it.left().data() == nullptr || it.right().data() == nullptr)
					throw compile_error("Wrong grammar for assign expression.");
				opt_expr(tree, it.left(), do_optm);
				opt_expr(tree, it.right(), do_optm);
				return;
			case signal_types::choice_: {
				token_signal *sig = dynamic_cast<token_signal *>(it.right().data());
				if (sig == nullptr || sig->get_signal() != signal_types::pair_)
					throw compile_error("Wrong grammar for choice expression.");
				opt_expr(tree, it.left(), do_optm);
				opt_expr(tree, it.right().left(), do_optm);
				opt_expr(tree, it.right().right(), do_optm);
				token_value *val = dynamic_cast<token_value *>(it.left().data());
				if (val != nullptr) {
					if (val->get_value().type() == typeid(boolean)) {
						if (val->get_value().const_val<boolean>())
							tree.reserve_left(it.right());
						else
							tree.reserve_right(it.right());
						tree.reserve_right(it);
					}
					else
						throw compile_error("Choice condition must be boolean.");
				}
				return;
			}
			case signal_types::arrow_:
				if (it.left().data() == nullptr || it.right().data() == nullptr ||
				        it.right().data()->get_type() != token_types::id)
					throw compile_error("Wrong grammar for arrow expression.");
				opt_expr(tree, it.left(), do_optm);
				return;
			case signal_types::dot_: {
				tree_type<token_base *> ltree(it.left());
				opt_expr(tree, it.left(), optm_type::enable_namespace_optm);
				token_base *lptr = it.left().data();
				token_base *rptr = it.right().data();
				if (rptr == nullptr || rptr->get_type() != token_types::id)
					throw compile_error("Wrong grammar for dot expression.");
				if (lptr != nullptr && lptr->get_type() == token_types::value) {
					const var &a = static_cast<token_value *>(lptr)->get_value();
					token_base *orig_ptr = it.data();
					try {
						const var &v = context->instance->parse_dot(a, rptr);
						if (v.is_protect())
							it.data() = new_value(v);
					}
					catch (...) {
						// Fix(2020-12-05): Broken AST structure caused by tree_type::merge
						it.data() = orig_ptr;
						tree.merge(it.left(), ltree);
					}
				}
				return;
			}
			case signal_types::fcall_: {
				opt_expr(tree, it.left(), do_optm);
				opt_expr(tree, it.right(), do_optm);
				token_base *lptr = it.left().data();
				token_base *rptr = it.right().data();
				if (lptr == nullptr || rptr == nullptr || rptr->get_type() != token_types::arglist)
					throw compile_error("Wrong syntax for function call.");
				if (lptr->get_type() == token_types::value) {
					var &a = static_cast<token_value *>(lptr)->get_value();
					if (a.type() == typeid(callable) && a.const_val<callable>().is_request_fold()) {
						token_base *ptr = nullptr;
						for (auto &tree: static_cast<token_arglist *>(rptr)->get_arglist()) {
							ptr = tree.root().data();
							if (ptr != nullptr && ptr->get_type() == token_types::expand) {
								if (!optimizable(static_cast<token_expand *>(ptr)->get_tree().root()))
									return;
							}
							else {
								if (!optimizable(tree.root()))
									return;
							}
						}
						token_base *oldt = it.data();
						try {
							vector args;
							args.reserve(static_cast<token_arglist *>(rptr)->get_arglist().size());
							for (auto &tree: static_cast<token_arglist *>(rptr)->get_arglist()) {
								ptr = tree.root().data();
								if (ptr != nullptr && ptr->get_type() == token_types::expand) {
									const auto &arr = context->instance->parse_expr(
									                      static_cast<token_expand *>(ptr)->get_tree().root()).const_val<array>();
									for (auto &it: arr)
										args.push_back(lvalue(it));
								}
								else
									args.push_back(lvalue(context->instance->parse_expr(tree.root())));
							}
							it.data() = new_value(a.const_val<callable>().call(args));
						}
						catch (...) {
							it.data() = oldt;
						}
					}
					else if (a.type() == typeid(object_method) &&
					         a.const_val<object_method>().is_request_fold) {
						token_base *ptr = nullptr;
						for (auto &tree: static_cast<token_arglist *>(rptr)->get_arglist()) {
							ptr = tree.root().data();
							if (ptr != nullptr && ptr->get_type() == token_types::expand) {
								if (!optimizable(static_cast<token_expand *>(ptr)->get_tree().root()))
									return;
							}
							else {
								if (!optimizable(tree.root()))
									return;
							}
						}
						token_base *oldt = it.data();
						try {
							const auto &om = a.const_val<object_method>();
							vector args{om.object};
							args.reserve(static_cast<token_arglist *>(rptr)->get_arglist().size());
							for (auto &tree: static_cast<token_arglist *>(rptr)->get_arglist()) {
								ptr = tree.root().data();
								if (ptr != nullptr && ptr->get_type() == token_types::expand) {
									const auto &arr = context->instance->parse_expr(
									                      static_cast<token_expand *>(ptr)->get_tree().root()).const_val<array>();
									for (auto &it: arr)
										args.push_back(lvalue(it));
								}
								else
									args.push_back(lvalue(context->instance->parse_expr(tree.root())));
							}
							it.data() = new_value(om.callable.const_val<callable>().call(args));
						}
						catch (...) {
							it.data() = oldt;
						}
					}
				}
				return;
			}
			}
		}
		}
		opt_expr(tree, it.left(), do_optm);
		opt_expr(tree, it.right(), do_optm);
		if (optimizable(it.left()) && optimizable(it.right())) {
			token_base *oldt = it.data();
			try {
				token_value *token = new_value(context->instance->parse_expr(it));
				tree.
				erase_left(it);
				tree.
				erase_right(it);
				it.data() = token;
			}
			catch (...) {
				it.data() = oldt;
			}
		}
	}